

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Apu.cpp
# Opt level: O2

void __thiscall Ay_Apu::reset(Ay_Apu *this)

{
  long lVar1;
  
  this->last_time = 0;
  (this->noise).delay = 0;
  (this->noise).lfsr = 1;
  lVar1 = 0x30;
  do {
    *(undefined4 *)((long)&this->oscs[0].period + lVar1) = 0x10;
    *(undefined8 *)((long)&this->oscs[0].delay + lVar1) = 0;
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  for (lVar1 = 0; lVar1 != -0x10; lVar1 = lVar1 + -1) {
    this->regs[lVar1 + 0xf] = '\0';
  }
  this->regs[7] = 0xff;
  (this->env).wave = (this->env).modes[2];
  (this->env).pos = -0x30;
  (this->env).delay = 0;
  this->regs[0xd] = '\t';
  return;
}

Assistant:

void Ay_Apu::reset()
{
	last_time   = 0;
	noise.delay = 0;
	noise.lfsr  = 1;
	
	osc_t* osc = &oscs [osc_count];
	do
	{
		osc--;
		osc->period   = period_factor;
		osc->delay    = 0;
		osc->last_amp = 0;
		osc->phase    = 0;
	}
	while ( osc != oscs );
	
	for ( int i = sizeof regs; --i >= 0; )
		regs [i] = 0;
	regs [7] = 0xFF;
	write_data_( 13, 0 );
}